

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,FunctionStmtBlock *stmt)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar4;
  long lVar5;
  size_t __first;
  pointer __last;
  int iVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InternalException *this_01;
  long *plVar12;
  Port *port;
  SystemVerilogCodeGen *pSVar13;
  long lVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint64_t i;
  key_type *__k;
  char *pcVar15;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_00;
  string_view sVar16;
  string_view format_str;
  format_args args;
  ulong local_108 [3];
  key_type *local_f0;
  undefined1 local_e8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ordering;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  undefined1 local_90 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  long local_58;
  long local_50;
  long lStack_48;
  ostream *local_40;
  SystemVerilogCodeGen *local_38;
  
  local_38 = this;
  iVar6 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])(stmt);
  if (((char)iVar6 == '\0') &&
     (iVar6 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])(stmt),
     (char)iVar6 == '\0')) {
    if (local_38->generator_->debug == true) {
      (stmt->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln =
           *(uint32_t *)&(local_38->stream_).super_stringstream.field_0x90;
    }
    iVar6 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x11])(stmt);
    pSVar13 = local_38;
    if ((char)iVar6 == '\0') {
      local_90 = (undefined1  [8])&ports._M_t._M_impl.super__Rb_tree_header;
      ports._M_t._M_impl._0_8_ = 0;
      ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
      iVar6 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xe])(stmt);
      if ((char)iVar6 == '\0') {
        std::__cxx11::string::_M_replace
                  ((ulong)local_90,0,(char *)ports._M_t._M_impl._0_8_,0x23c7de);
      }
      else {
        peVar3 = (stmt->function_handler_).
                 super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_00 = (stmt->function_handler_).
                  super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (peVar3 == (element_type *)0x0) {
          iVar6 = 0x20;
        }
        else {
          iVar6 = (*(peVar3->super_IRNode)._vptr_IRNode[7])();
        }
        local_108[0] = (ulong)(iVar6 - 1);
        format_str.size_ = 2;
        format_str.data_ = (char *)0x7;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_108;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)&ordering._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (detail *)"[{0}:0]",format_str,args);
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&ordering._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count,0,(char *)0x0,0x24216f);
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_50 = *plVar12;
          lStack_48 = plVar7[3];
          ports._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_50;
        }
        else {
          local_50 = *plVar12;
          ports._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*plVar7;
        }
        local_58 = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append
                                   ((char *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        p_Var1 = &ordering._M_t._M_impl.super__Rb_tree_header;
        plVar12 = plVar7 + 2;
        if ((_Rb_tree_header *)*plVar7 == (_Rb_tree_header *)plVar12) {
          ordering._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar12;
          ordering._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)plVar7[3];
          local_e8 = (undefined1  [8])p_Var1;
        }
        else {
          ordering._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar12;
          local_e8 = (undefined1  [8])*plVar7;
        }
        ordering._M_t._M_impl._0_8_ = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_90,(string *)local_e8);
        if (local_e8 != (undefined1  [8])p_Var1) {
          operator_delete((void *)local_e8,
                          ordering._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        }
        if ((long *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_50) {
          operator_delete((void *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          local_50 + 1);
        }
        if ((pointer *)ordering._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            &port_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)ordering._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (ulong)((long)&((port_names.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)
                                         ._M_p + 1));
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      puVar2 = &(local_38->stream_).super_stringstream.field_0x10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"function ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar2,(char *)local_90,ports._M_t._M_impl._0_8_);
      pSVar13 = local_38;
      if (local_90 != (undefined1  [8])&ports._M_t._M_impl.super__Rb_tree_header) {
        operator_delete((void *)local_90,
                        CONCAT71(ports._M_t._M_impl.super__Rb_tree_header._M_header._1_7_,
                                 (undefined1)
                                 ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color) + 1);
        pSVar13 = local_38;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_38->stream_).super_stringstream.field_0x10,"task ",5);
    }
    puVar2 = &(pSVar13->stream_).super_stringstream.field_0x10;
    p_Var1 = &ports._M_t._M_impl.super__Rb_tree_header;
    pcVar4 = (stmt->function_name_)._M_dataplus._M_p;
    local_90 = (undefined1  [8])p_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar4,pcVar4 + (stmt->function_name_)._M_string_length);
    local_40 = (ostream *)puVar2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar2,(char *)local_90,ports._M_t._M_impl._0_8_);
    if (local_90 != (undefined1  [8])p_Var1) {
      operator_delete((void *)local_90,
                      CONCAT71(ports._M_t._M_impl.super__Rb_tree_header._M_header._1_7_,
                               (undefined1)
                               ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color) + 1);
    }
    poVar11 = local_40;
    if ((stmt->ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_40,";",1);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pSVar13 = local_38;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_40,"(",1);
      pSVar13 = local_38;
      puVar2 = &(local_38->stream_).super_stringstream.field_0x90;
      *(long *)puVar2 = *(long *)puVar2 + 1;
      local_90[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_90,1);
    }
    pSVar13->indent_ = pSVar13->indent_ + 1;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                *)local_90,&(stmt->ports_)._M_t);
    ordering._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    port_names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    port_names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ordering._M_t._M_impl.super__Rb_tree_header._M_node_count,
              (size_type)ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)local_e8,&(stmt->port_ordering_)._M_t);
    if (ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Rb_tree_node_base *)&ports
       ) {
      p_Var8 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &ordering._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1)
                  );
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != (_Rb_tree_node_base *)&ports);
    }
    __last = port_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __first = ordering._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (ordering._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
      if (ordering._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
          ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ports._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   "Port ordering size mismatches ports","");
        InternalException::InternalException
                  (this_01,(string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
        __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((pointer)ordering._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          port_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar14 = (long)port_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                 ordering._M_t._M_impl.super__Rb_tree_header._M_node_count;
        uVar9 = lVar14 >> 5;
        lVar5 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock*)::__0>>
                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )ordering._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )port_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:685:57)>
                    )local_e8);
        if (lVar14 < 0x201) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__first,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:685:57)>
                               )local_e8);
        }
        else {
          __last_00._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (__first + 0x200);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__first,__last_00,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:685:57)>
                      )local_e8);
          if (__last_00._M_current != __last) {
            do {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock*)::__0>>
                        (__last_00,
                         (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:685:57)>
                          )local_e8);
              __last_00._M_current = __last_00._M_current + 1;
            } while (__last_00._M_current != __last);
          }
        }
      }
    }
    local_f0 = port_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)ordering._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        port_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      p_Var8 = (_Base_ptr)0x1;
      __k = (key_type *)ordering._M_t._M_impl.super__Rb_tree_header._M_node_count;
      do {
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                        *)local_90,__k);
        pSVar13 = (SystemVerilogCodeGen *)
                  (pmVar10->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (local_38->generator_->debug == true) {
          *(undefined4 *)&(pSVar13->empty_indent_str_)._M_string_length =
               *(undefined4 *)&(local_38->stream_).super_stringstream.field_0x90;
        }
        sVar16 = indent(local_38);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_40,sVar16._M_str,sVar16._M_len);
        get_port_str_abi_cxx11_
                  ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,pSVar13,port);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,(char *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count,local_58);
        if ((long *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_50) {
          operator_delete((void *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          local_50 + 1);
        }
        if (p_Var8 == ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
          puVar2 = &(local_38->stream_).super_stringstream.field_0x90;
          *(long *)puVar2 = *(long *)puVar2 + 1;
          ports._M_t._M_impl.super__Rb_tree_header._M_node_count =
               CONCAT71(ports._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_40,(char *)&ports._M_t._M_impl.super__Rb_tree_header.
                                                 _M_node_count,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,");",2);
          puVar2 = &(local_38->stream_).super_stringstream.field_0x90;
          *(long *)puVar2 = *(long *)puVar2 + 1;
          ports._M_t._M_impl.super__Rb_tree_header._M_node_count =
               CONCAT71(ports._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(char *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_40,",",1);
          puVar2 = &(local_38->stream_).super_stringstream.field_0x90;
          *(long *)puVar2 = *(long *)puVar2 + 1;
          ports._M_t._M_impl.super__Rb_tree_header._M_node_count =
               CONCAT71(ports._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40,(char *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
        }
        __k = __k + 1;
        p_Var8 = (_Base_ptr)((long)&p_Var8->_M_color + 1);
      } while (__k != local_f0);
    }
    local_38->indent_ = local_38->indent_ - 1;
    std::__ostream_insert<char,std::char_traits<char>>(local_40,"begin",5);
    puVar2 = &(local_38->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    ports._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(ports._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40,(char *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
    local_38->indent_ = local_38->indent_ + 1;
    for (uVar9 = 0; iVar6 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[1])(stmt)
        , uVar9 < CONCAT44(extraout_var,iVar6); uVar9 = uVar9 + 1) {
      iVar6 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[2])(stmt,uVar9);
      (**local_38->_vptr_SystemVerilogCodeGen)(local_38,CONCAT44(extraout_var_00,iVar6));
    }
    local_38->indent_ = local_38->indent_ - 1;
    iVar6 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x11])(stmt);
    pcVar15 = "endfunction";
    if ((byte)iVar6 != 0) {
      pcVar15 = "endtask";
    }
    sVar16 = indent(local_38);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_40,sVar16._M_str,sVar16._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"end",3);
    puVar2 = &(local_38->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    ports._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(ports._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,pcVar15,(ulong)(byte)((byte)iVar6 ^ 1) * 4 + 7);
    puVar2 = &(local_38->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    ports._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(ports._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(char *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ordering._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                 *)local_90);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock* stmt) {
    // dpi is external module
    if (stmt->is_dpi() || stmt->is_builtin()) return;
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }
    if (stmt->is_task()) {
        stream_ << "task ";
    } else {
        std::string return_str;
        if (stmt->has_return_value()) {
            auto handler = stmt->function_handler();
            auto width = 32u;
            if (handler) {
                width = handler->width();
            }
            return_str = "logic" + get_width_str(width) + " ";
        } else {
            return_str = "void ";
        }
        stream_ << "function " << return_str;
    }

    stream_ << stmt->function_name();
    if (stmt->ports().empty()) {
        stream_ << ";" << std::endl;
    } else {
        stream_ << "(" << stream_.endl();
    }

    indent_++;
    uint64_t count = 0;
    auto ports = stmt->ports();
    // if the ordering is specified, use the ordering
    // otherwise use the default map ordering, which is sorted alphabetically
    std::vector<std::string> port_names;
    port_names.reserve(ports.size());
    auto ordering = stmt->port_ordering();
    for (auto const& iter : ports) port_names.emplace_back(iter.first);
    if (!ordering.empty()) {
        if (ordering.size() != ports.size())
            throw InternalException("Port ordering size mismatches ports");
        // sort the list
        std::sort(port_names.begin(), port_names.end(), [&](auto const& lhs, auto const& rhs) {
            return ordering.at(lhs) < ordering.at(rhs);
        });
    }
    for (auto const& port_name : port_names) {
        auto* port = ports.at(port_name).get();
        if (generator_->debug) port->verilog_ln = stream_.line_no();
        stream_ << indent() << get_port_str(port);
        if (++count != ports.size())
            stream_ << "," << stream_.endl();
        else
            stream_ << stream_.endl() << ");" << stream_.endl();
    }
    indent_--;

    stream_ << "begin" << stream_.endl();
    indent_++;
    for (uint64_t i = 0; i < stmt->child_count(); i++) {
        dispatch_node(stmt->get_child(i));
    }
    indent_--;
    auto const* end_token = stmt->is_task() ? "endtask" : "endfunction";
    stream_ << indent() << "end" << stream_.endl() << end_token << stream_.endl();
}